

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O3

text * lest::pluralise(text *__return_storage_ptr__,text *word,int n)

{
  pointer pcVar1;
  ulong *local_60;
  size_type local_58;
  ulong uStack_50;
  undefined8 uStack_48;
  ulong *local_40;
  undefined8 local_38;
  ulong uStack_30;
  undefined8 uStack_28;
  
  if (n == 1) {
    local_60 = &uStack_50;
    pcVar1 = (word->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar1,pcVar1 + word->_M_string_length);
    goto LAB_00143497;
  }
  pcVar1 = (word->_M_dataplus)._M_p;
  local_60 = &uStack_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + word->_M_string_length);
  std::__cxx11::string::append((char *)&local_60);
  local_40 = &uStack_30;
  if (local_60 == &uStack_50) {
    uStack_28 = uStack_48;
LAB_00143475:
    uStack_48 = uStack_28;
    local_60 = &uStack_50;
  }
  else if (local_60 == local_40) goto LAB_00143475;
  local_38 = 0;
  uStack_30 = uStack_50 & 0xffffffffffffff00;
LAB_00143497:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_60 == &uStack_50) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = uStack_50;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_48;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_60;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = uStack_50;
  }
  __return_storage_ptr__->_M_string_length = local_58;
  local_58 = 0;
  uStack_50 = uStack_50 & 0xffffffffffffff00;
  if ((n != 1) && (local_40 != &uStack_30)) {
    local_60 = &uStack_50;
    operator_delete(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

inline text pluralise( text word, int n )
{
    return n == 1 ? word : word + "s";
}